

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixInstance::setupUniforms
          (ShaderMatrixInstance *this,Vec4 *param_1)

{
  bool bVar1;
  long lVar2;
  float *dataPtr;
  DataType dataType;
  long lVar3;
  undefined1 *puVar4;
  undefined1 *dataPtr_00;
  undefined1 *dataPtr_01;
  undefined8 *data;
  undefined1 *data_00;
  undefined1 *data_01;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  deUint32 local_74;
  
  bVar1 = MatrixCaseUtils::isOperationBinary(this->m_op);
  lVar3 = 0;
  data = &sr::(anonymous_namespace)::s_constInFloat;
  data_00 = sr::(anonymous_namespace)::s_constInVec2;
  data_01 = sr::(anonymous_namespace)::s_constInVec3;
  puVar5 = sr::(anonymous_namespace)::s_constInMat2x3;
  dataPtr_00 = sr::(anonymous_namespace)::s_constInMat2x4;
  dataPtr_01 = sr::(anonymous_namespace)::s_constInMat3x2;
  puVar8 = sr::(anonymous_namespace)::s_constInMat3x3;
  puVar9 = sr::(anonymous_namespace)::s_constInMat3x4;
  puVar6 = sr::(anonymous_namespace)::s_constInMat4x2;
  puVar7 = sr::(anonymous_namespace)::s_constInMat4x3;
  puVar4 = sr::(anonymous_namespace)::s_constInMat4x4;
  local_74 = 0;
  do {
    if ((ulong)bVar1 * 0x10 + 0x10 == lVar3) {
      return;
    }
    lVar2 = 0x21c;
    if (lVar3 == 0) {
      lVar2 = 0x210;
    }
    if (*(int *)((long)&(((ShaderRenderCaseInstance *)
                         (&(this->super_ShaderRenderCaseInstance).m_clearColor + -3))->
                        super_TestInstance)._vptr_TestInstance + lVar2) != 1) goto LAB_00598cd7;
    switch(*(undefined4 *)
            ((long)(this->super_ShaderRenderCaseInstance).m_clearColor.m_data + lVar2 + -0x2c)) {
    case 1:
      ShaderRenderCaseInstance::addUniform
                (&this->super_ShaderRenderCaseInstance,local_74,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,4,
                 data);
      break;
    case 2:
      ShaderRenderCaseInstance::addUniform<tcu::Vector<float,2>>
                (&this->super_ShaderRenderCaseInstance,local_74,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                 (Vector<float,_2> *)data_00);
      break;
    case 3:
      ShaderRenderCaseInstance::addUniform<tcu::Vector<float,3>>
                (&this->super_ShaderRenderCaseInstance,local_74,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                 (Vector<float,_3> *)data_01);
      break;
    case 4:
      ShaderRenderCaseInstance::addUniform<tcu::Vector<float,4>>
                (&this->super_ShaderRenderCaseInstance,local_74,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                 (Vector<float,_4> *)(sr::(anonymous_namespace)::s_constInVec4 + lVar3));
      break;
    case 5:
      dataPtr = (float *)(sr::(anonymous_namespace)::s_constInMat2x2 + lVar3);
      dataType = TYPE_FLOAT_MAT2;
      goto LAB_00598cab;
    case 6:
      dataType = TYPE_FLOAT_MAT2X3;
      dataPtr = (float *)puVar5;
      goto LAB_00598cab;
    case 7:
      addMatrixUniform(this,local_74,TYPE_FLOAT_MAT2X4,(float *)dataPtr_00);
      break;
    case 8:
      addMatrixUniform(this,local_74,TYPE_FLOAT_MAT3X2,(float *)dataPtr_01);
      break;
    case 9:
      dataType = TYPE_FLOAT_MAT3;
      dataPtr = (float *)puVar8;
      goto LAB_00598cab;
    case 10:
      dataType = TYPE_FLOAT_MAT3X4;
      dataPtr = (float *)puVar9;
      goto LAB_00598cab;
    case 0xb:
      dataType = TYPE_FLOAT_MAT4X2;
      dataPtr = (float *)puVar6;
      goto LAB_00598cab;
    case 0xc:
      dataType = TYPE_FLOAT_MAT4X3;
      dataPtr = (float *)puVar7;
      goto LAB_00598cab;
    case 0xd:
      dataType = TYPE_FLOAT_MAT4;
      dataPtr = (float *)puVar4;
LAB_00598cab:
      addMatrixUniform(this,local_74,dataType,dataPtr);
    }
    local_74 = local_74 + 1;
LAB_00598cd7:
    lVar3 = lVar3 + 0x10;
    data = (undefined8 *)((long)data + 4);
    data_00 = (undefined1 *)((long)data_00 + 8);
    data_01 = (undefined1 *)((long)data_01 + 0xc);
    puVar5 = (undefined1 *)((long)puVar5 + 0x18);
    dataPtr_00 = (undefined1 *)((long)dataPtr_00 + 0x20);
    dataPtr_01 = (undefined1 *)((long)dataPtr_01 + 0x18);
    puVar8 = (undefined1 *)((long)puVar8 + 0x24);
    puVar9 = (undefined1 *)((long)puVar9 + 0x30);
    puVar6 = (undefined1 *)((long)puVar6 + 0x20);
    puVar7 = (undefined1 *)((long)puVar7 + 0x30);
    puVar4 = (undefined1 *)((long)puVar4 + 0x40);
  } while( true );
}

Assistant:

void ShaderMatrixInstance::setupUniforms (const tcu::Vec4&)
{
	const int	numInputs		= isOperationBinary(m_op) ? 2 : 1;
	deUint32	uniformBinding	= 0;

	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			switch (in.dataType)
			{
				case TYPE_FLOAT:		addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, sizeof(float), &s_constInFloat[inNdx]);					break;
				case TYPE_FLOAT_VEC2:	addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, s_constInVec2[inNdx]);			break;
				case TYPE_FLOAT_VEC3:	addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, s_constInVec3[inNdx]);			break;
				case TYPE_FLOAT_VEC4:	addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, s_constInVec4[inNdx]);			break;
				// \note GLES3 supports transpose in matrix upload.
				case TYPE_FLOAT_MAT2:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat2x2[inNdx]);	break;
				case TYPE_FLOAT_MAT2X3:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat2x3[inNdx]);	break;
				case TYPE_FLOAT_MAT2X4:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat2x4[inNdx]);	break;
				case TYPE_FLOAT_MAT3X2:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat3x2[inNdx]);	break;
				case TYPE_FLOAT_MAT3:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat3x3[inNdx]);	break;
				case TYPE_FLOAT_MAT3X4:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat3x4[inNdx]);	break;
				case TYPE_FLOAT_MAT4X2:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat4x2[inNdx]);	break;
				case TYPE_FLOAT_MAT4X3:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat4x3[inNdx]);	break;
				case TYPE_FLOAT_MAT4:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat4x4[inNdx]);	break;
				default:
					DE_ASSERT(false);
			}
			uniformBinding++;
		}
	}
}